

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O1

void model_estimate(double *x,int N,int d,int pmax,int h)

{
  uint uVar1;
  int iVar2;
  double *oup;
  ulong uVar3;
  undefined4 in_register_0000000c;
  long lVar4;
  uint p;
  long lVar5;
  double *pdVar6;
  int pq;
  long lVar7;
  uint q;
  uint uVar8;
  bool bVar9;
  double dVar10;
  double dVar11;
  double local_c8;
  double sos;
  double var;
  double local_b0;
  double local_a8;
  double local_a0;
  double *local_98;
  undefined8 local_90;
  double *local_88;
  uint local_7c;
  double local_78;
  double local_70;
  double *local_68;
  double local_60;
  double local_58;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  local_90 = CONCAT44(in_register_0000000c,pmax);
  local_34 = h;
  oup = (double *)malloc((long)(N - d) << 3);
  if (0 < d) {
    N = diff(x,N,d,oup);
  }
  lVar7 = (long)(int)local_34;
  local_88 = (double *)malloc(lVar7 * 8);
  local_68 = (double *)malloc((long)N * 8);
  dVar10 = mean(x,N);
  pdVar6 = local_88;
  if (0 < N) {
    uVar3 = 0;
    do {
      oup[uVar3] = x[uVar3] - dVar10;
      uVar3 = uVar3 + 1;
    } while ((uint)N != uVar3);
  }
  local_50 = N;
  ywalg(oup,N,local_34,local_88);
  if (0 < (int)local_50) {
    memset(local_68,0,(ulong)(uint)N << 3);
  }
  if ((int)local_34 < (int)local_50) {
    lVar4 = (lVar7 << 0x20) + -0x100000000;
    do {
      local_68[lVar7] = oup[lVar7];
      if (0 < (int)local_34) {
        dVar10 = local_68[lVar7];
        uVar3 = 0;
        lVar5 = lVar4;
        do {
          dVar10 = dVar10 - pdVar6[uVar3] * *(double *)((long)oup + (lVar5 >> 0x1d));
          uVar3 = uVar3 + 1;
          lVar5 = lVar5 + -0x100000000;
        } while (local_34 != uVar3);
        local_68[lVar7] = dVar10;
      }
      lVar7 = lVar7 + 1;
      lVar4 = lVar4 + 0x100000000;
    } while (lVar7 != N);
  }
  iVar2 = (int)local_90;
  pdVar6 = local_68;
  local_98 = oup;
  if (iVar2 < 0) {
    local_38 = 0;
    local_3c = 0;
    local_40 = 0;
    local_44 = 0;
    local_4c = 0;
    local_48 = 0;
  }
  else {
    local_78 = (double)(int)local_50;
    dVar10 = 0.0;
    local_70 = 0.0;
    uVar8 = 0;
    local_48 = 0;
    local_4c = 0;
    local_44 = 0;
    local_40 = 0;
    local_3c = 0;
    local_38 = 0;
    dVar11 = 0.0;
    p = 0;
    do {
      uVar3 = 0;
      local_7c = uVar8;
      do {
        q = (uint)uVar3;
        pq = p + q;
        if (pq != 0) {
          var = dVar10;
          local_b0 = dVar11;
          hrstep2(local_98,local_50,local_34,p,q,pq,pdVar6,&local_c8,&sos);
          local_58 = log(sos);
          local_60 = (double)pq;
          local_a8 = (double)uVar8 / local_78 + local_58;
          dVar10 = log(local_78);
          local_a0 = (dVar10 * local_60) / local_78 + local_58;
          dVar10 = log(local_78);
          dVar10 = log(dVar10);
          dVar10 = ((dVar10 + dVar10) * local_60) / local_78 + local_58;
          if (q == 1 && p == 0) {
            local_3c = 1;
            local_38 = 0;
            local_60 = local_a8;
            local_58 = local_a0;
            local_40 = 0;
            local_44 = 1;
            local_4c = 0;
            local_48 = 1;
            local_70 = dVar10;
          }
          else {
            if (local_a8 < local_b0) {
              local_3c = q;
              local_38 = p;
            }
            if (local_a0 < var) {
              local_40 = p;
            }
            local_60 = local_a8;
            if (local_b0 <= local_a8) {
              local_60 = local_b0;
            }
            local_58 = local_a0;
            uVar1 = q;
            if (var <= local_a0) {
              local_58 = var;
              uVar1 = local_44;
            }
            local_44 = uVar1;
            if (dVar10 < local_70) {
              local_70 = dVar10;
              local_4c = p;
              local_48 = q;
            }
          }
          printf("\n p = %d q = %d AIC = %g SC = %g HQ = %g \n",local_a8,local_a0,(ulong)p,uVar3);
          pdVar6 = local_68;
          dVar10 = local_58;
          dVar11 = local_60;
        }
        uVar3 = (ulong)(q + 1);
        uVar8 = uVar8 + 2;
      } while (iVar2 + 1U != q + 1);
      uVar8 = local_7c + 2;
      bVar9 = p != (uint)local_90;
      p = p + 1;
    } while (bVar9);
  }
  puts("\n");
  printf("AIC Estimate : p = %d q = %d \n",(ulong)local_38,(ulong)local_3c);
  printf("SC Estimate  : p = %d q = %d \n",(ulong)local_40,(ulong)local_44);
  printf("HQ Estimate  : p = %d q = %d \n",(ulong)local_4c,(ulong)local_48);
  free(local_98);
  free(local_88);
  free(pdVar6);
  return;
}

Assistant:

void model_estimate(double *x, int N, int d, int pmax, int h) {
	int m, i, t, pq, j;
	double wmean, sos, var, lvar, aic, sc, hq, aic0, sc0, hq0;
	double *inp, *phim, *a;
	int paic, qaic, psc, qsc, phq, qhq;
	/*
	x - Input Time Series of length N
	d - Number of time the series has to be differenced (d = 0 when there are no trends)
	pmax - Maximum AR and MA order pmax = max(p,q)
	h - Order of AR model to be fitted to obtain residuals
	0 <= pmax <= h
	Typically pmax = 3,4 and h = 8. Increase value of h if you want to fit high order ARMA process
	*/

	inp = (double*)malloc(sizeof(double)* (N - d));

	if (d > 0) {
		N = diff(x, N, d, inp); // No need to demean x
	}

	m = h;

	phim = (double*)malloc(sizeof(double)* m);
	a = (double*)malloc(sizeof(double)* N);

	wmean = mean(x, N);

	for (i = 0; i < N; ++i) {
		inp[i] = x[i] - wmean;
	}

	// Estimate AR(m) coefficients

	ywalg(inp, N, m, phim);

	for (i = 0; i < N; ++i) {
		a[i] = 0.0;
	}

	for (t = m; t < N; ++t) {
		a[t] = inp[t];
		for (i = 0; i < m; ++i) {
			a[t] -= phim[i] * inp[t - i - 1];
		}
	}
	aic0 = sc0 = hq0 = 0.0;
	paic = qaic = psc = qsc = phq = qhq = 0;

	for (i = 0; i <= pmax; ++i) {
		for (j = 0; j <= pmax; ++j) {
			pq = i + j;
			if (pq >= 1) {
				hrstep2(inp, N, m, i, j, pq, a, &sos, &var);
				lvar = log(var);
				aic = lvar + 2 * (double)pq / N;
				sc = lvar + log((double)N) * (double)pq / N;
				hq = lvar + 2 * log(log((double)N)) * (double)pq / N;
				if (i == 0 && j == 1) {
					aic0 = aic;
					sc0 = sc;
					hq0 = hq;
					paic = psc = phq = 0;
					qaic = qsc = qhq = 1;
				}
				else {
					if (aic < aic0) {
						aic0 = aic;
						paic = i;
						qaic = j;
					}
					if (sc < sc0) {
						sc0 = sc;
						psc = i;
						qsc = j;
					}
					if (hq < hq0) {
						hq0 = hq;
						phq = i;
						qhq = j;
					}
				}
				printf("\n p = %d q = %d AIC = %g SC = %g HQ = %g \n", i, j, aic, sc, hq);
			}
		}
	}

	printf("\n\n");
	printf("AIC Estimate : p = %d q = %d \n", paic, qaic);
	printf("SC Estimate  : p = %d q = %d \n", psc, qsc);
	printf("HQ Estimate  : p = %d q = %d \n", phq, qhq);

	free(inp);
	free(phim);
	free(a);
}